

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O2

void __thiscall CEExecOptions::AddObservedPars(CEExecOptions *this)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"a,azimuth",&local_49);
  std::__cxx11::string::string
            ((string *)&local_48,"Azimuth angle (degrees, north=0, east=90)",&local_4a);
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_28,&local_48,0.0);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"z,zenith",&local_49);
  std::__cxx11::string::string((string *)&local_48,"Zenith angle (degrees)",&local_4a);
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_28,&local_48,0.0);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

inline
void CEExecOptions::AddObservedPars(void)
{
    AddDoubleParam("a,azimuth", "Azimuth angle (degrees, north=0, east=90)", 0.0);
    AddDoubleParam("z,zenith", "Zenith angle (degrees)", 0.0);
}